

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodel_p.h
# Opt level: O3

CheckState QtPrivate::legacyEnumValueFromModelData<Qt::CheckState>(QVariant *data)

{
  PrivateShared *pPVar1;
  bool bVar2;
  __atomic_base<int> _Var3;
  __atomic_base<int> _Var4;
  CheckState CVar5;
  QMetaType QVar6;
  long in_FS_OFFSET;
  QMetaType local_30;
  QMetaType local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  _Var3._M_i = QVariant::typeId(data);
  _Var4._M_i = (__int_type)QMetaTypeInterfaceWrapper<Qt::CheckState>::metaType.typeId;
  if ((__atomic_base<int>)
      QMetaTypeInterfaceWrapper<Qt::CheckState>::metaType.typeId._q_value.super___atomic_base<int>.
      _M_i == (__atomic_base<int>)0x0) {
    _Var4._M_i = QMetaType::registerHelper(&QMetaTypeInterfaceWrapper<Qt::CheckState>::metaType);
  }
  if (_Var3._M_i == _Var4._M_i) {
    local_28.d_ptr = &QMetaTypeInterfaceWrapper<Qt::CheckState>::metaType;
    local_30.d_ptr = (QMetaTypeInterface *)(*(ulong *)&(data->d).field_0x18 & 0xfffffffffffffffc);
    bVar2 = comparesEqual(&local_30,&local_28);
    if (bVar2) {
      if (((data->d).field_0x18 & 1) != 0) {
        pPVar1 = (data->d).data.shared;
        data = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
      }
      CVar5 = *(CheckState *)&((Private *)&((PrivateShared *)data)->field_0x0)->data;
    }
    else {
      local_30.d_ptr = local_30.d_ptr & 0xffffffff00000000;
      QVar6.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if (((data->d).field_0x18 & 1) != 0) {
        pPVar1 = (data->d).data.shared;
        data = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
      }
      QMetaType::convert(QVar6,data,local_28,&local_30);
      CVar5 = (CheckState)local_30.d_ptr;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return CVar5;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    CVar5 = QVariant::toInt((bool *)data);
    return CVar5;
  }
  __stack_chk_fail();
}

Assistant:

T legacyEnumValueFromModelData(const QVariant &data)
{
    static_assert(std::is_enum_v<T>);
    if (data.userType() == qMetaTypeId<T>()) {
        return data.value<T>();
    } else if (std::is_same_v<std::underlying_type_t<T>, int> ||
               std::is_same_v<std::underlying_type_t<T>, uint>) {
        return T(data.toInt());
    }

    return T();
}